

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O0

void glfwSetWindowAttrib(GLFWwindow *handle,int attrib,int value)

{
  uint enabled;
  _GLFWwindow *window;
  int value_local;
  int attrib_local;
  GLFWwindow *handle_local;
  
  if (handle != (GLFWwindow *)0x0) {
    if (_glfw.initialized == 0) {
      _glfwInputError(0x10001,(char *)0x0);
    }
    else {
      enabled = (uint)(value != 0);
      if (attrib == 0x20006) {
        *(uint *)(handle + 0x10) = enabled;
      }
      else if (attrib == 0x20003) {
        *(uint *)(handle + 8) = enabled;
        if (*(long *)(handle + 0x50) == 0) {
          _glfwPlatformSetWindowResizable((_GLFWwindow *)handle,enabled);
        }
      }
      else if (attrib == 0x20005) {
        *(uint *)(handle + 0xc) = enabled;
        if (*(long *)(handle + 0x50) == 0) {
          _glfwPlatformSetWindowDecorated((_GLFWwindow *)handle,enabled);
        }
      }
      else if (attrib == 0x20007) {
        *(uint *)(handle + 0x14) = enabled;
        if (*(long *)(handle + 0x50) == 0) {
          _glfwPlatformSetWindowFloating((_GLFWwindow *)handle,enabled);
        }
      }
      else if (attrib == 0x2000c) {
        *(uint *)(handle + 0x18) = enabled;
      }
      else if (attrib == 0x2000d) {
        *(uint *)(handle + 0x1c) = enabled;
        _glfwPlatformSetWindowMousePassthrough((_GLFWwindow *)handle,enabled);
      }
      else {
        _glfwInputError(0x10003,"Invalid window attribute 0x%08X",(ulong)(uint)attrib);
      }
    }
    return;
  }
  __assert_fail("window != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/src/window.c"
                ,0x373,"void glfwSetWindowAttrib(GLFWwindow *, int, int)");
}

Assistant:

GLFWAPI void glfwSetWindowAttrib(GLFWwindow* handle, int attrib, int value)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    value = value ? GLFW_TRUE : GLFW_FALSE;

    if (attrib == GLFW_AUTO_ICONIFY)
        window->autoIconify = value;
    else if (attrib == GLFW_RESIZABLE)
    {
        window->resizable = value;
        if (!window->monitor)
            _glfwPlatformSetWindowResizable(window, value);
    }
    else if (attrib == GLFW_DECORATED)
    {
        window->decorated = value;
        if (!window->monitor)
            _glfwPlatformSetWindowDecorated(window, value);
    }
    else if (attrib == GLFW_FLOATING)
    {
        window->floating = value;
        if (!window->monitor)
            _glfwPlatformSetWindowFloating(window, value);
    }
    else if (attrib == GLFW_FOCUS_ON_SHOW)
        window->focusOnShow = value;
    else if (attrib == GLFW_MOUSE_PASSTHROUGH)
    {
        window->mousePassthrough = value;
        _glfwPlatformSetWindowMousePassthrough(window, value);
    }
    else
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid window attribute 0x%08X", attrib);
}